

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 floatx80_twotox_m68k(floatx80 a,float_status *status)

{
  char cVar1;
  char cVar2;
  uint32_t uVar3;
  unkuint10 Var4;
  unkuint10 Var5;
  flag fVar6;
  short sVar7;
  int32_t iVar8;
  uint uVar9;
  uint uVar10;
  uint64_t uVar11;
  uint16_t uVar12;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  floatx80 fVar13;
  floatx80 fVar14;
  floatx80 fVar15;
  floatx80 fVar16;
  floatx80 fVar17;
  floatx80 fVar18;
  floatx80 a_00;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  floatx80 a_06;
  floatx80 a_07;
  floatx80 a_08;
  floatx80 a_09;
  floatx80 a_10;
  floatx80 a_11;
  floatx80 a_12;
  floatx80 a_13;
  floatx80 a_14;
  floatx80 a_15;
  floatx80 a_16;
  floatx80 a_17;
  floatx80 a_18;
  floatx80 a_19;
  floatx80 a_20;
  floatx80 a_21;
  floatx80 b;
  floatx80 b_00;
  floatx80 b_01;
  floatx80 b_02;
  floatx80 b_03;
  floatx80 b_04;
  floatx80 b_05;
  floatx80 b_06;
  floatx80 b_07;
  floatx80 b_08;
  floatx80 b_09;
  floatx80 b_10;
  floatx80 b_11;
  floatx80 b_12;
  floatx80 b_13;
  floatx80 b_14;
  floatx80 b_15;
  floatx80 b_16;
  floatx80 b_17;
  floatx80 b_18;
  floatx80 b_19;
  floatx80 fact2;
  floatx80 fact1;
  floatx80 adjfact;
  floatx80 fp3;
  floatx80 fp2;
  floatx80 fp1;
  floatx80 fp0;
  int local_58;
  int32_t m1;
  int32_t m;
  int32_t l;
  int32_t j;
  int32_t n;
  int32_t compact;
  int8_t user_rnd_prec;
  int8_t user_rnd_mode;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  Var4 = a._0_10_;
  fVar14._10_6_ = 0;
  fVar14.low = (long)Var4;
  fVar14.high = (short)(Var4 >> 0x40);
  uVar11 = extractFloatx80Frac(fVar14);
  fVar15._10_6_ = 0;
  fVar15.low = (long)Var4;
  fVar15.high = (short)(Var4 >> 0x40);
  iVar8 = extractFloatx80Exp(fVar15);
  fVar16._10_6_ = 0;
  fVar16.low = (long)Var4;
  fVar16.high = (short)(Var4 >> 0x40);
  fVar6 = extractFloatx80Sign(fVar16);
  if (iVar8 == 0x7fff) {
    if ((uVar11 & 0x7fffffffffffffff) == 0) {
      if (fVar6 == '\0') {
        fVar13 = packFloatx80('\0',0x7fff,0);
        uVar12 = fVar13.high;
      }
      else {
        fVar13 = packFloatx80('\0',0,0);
        uVar12 = fVar13.high;
      }
    }
    else {
      a_00._10_6_ = 0;
      a_00.low = (long)Var4;
      a_00.high = (short)(Var4 >> 0x40);
      fVar13 = propagateFloatx80NaNOneArg(a_00,status);
      uVar12 = fVar13.high;
    }
  }
  else if ((iVar8 == 0) && (uVar11 == 0)) {
    fVar13 = packFloatx80('\0',0x3fff,0x8000000000000000);
    uVar12 = fVar13.high;
  }
  else {
    cVar1 = status->float_rounding_mode;
    cVar2 = status->floatx80_rounding_precision;
    status->float_rounding_mode = '\0';
    status->floatx80_rounding_precision = 'P';
    iVar8 = floatx80_make_compact(iVar8,uVar11);
    if ((iVar8 < 0x3fb98000) || (0x400d80c0 < iVar8)) {
      if (iVar8 < 0x3fff8001) {
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        fVar14 = float32_to_floatx80_m68k(0x3f800000,status);
        a_01._10_6_ = 0;
        a_01.low = (long)Var4;
        a_01.high = (short)(Var4 >> 0x40);
        b._10_6_ = 0;
        b.low = (long)fVar14._0_10_;
        b.high = (short)(fVar14._0_10_ >> 0x40);
        fVar14 = floatx80_add_m68k(a_01,b,status);
        uVar12 = fVar14.high;
        float_raise_m68k(' ',status);
        fVar13._8_8_ = extraout_RDX;
        fVar13.low = fVar14.low;
      }
      else {
        status->float_rounding_mode = cVar1;
        status->floatx80_rounding_precision = cVar2;
        if (fVar6 == '\0') {
          fVar13 = roundAndPackFloatx80_m68k
                             (status->floatx80_rounding_precision,'\0',0x8000,uVar11,0,status);
          uVar12 = fVar13.high;
        }
        else {
          fVar13 = roundAndPackFloatx80_m68k
                             (status->floatx80_rounding_precision,'\0',-0x1000,uVar11,0,status);
          uVar12 = fVar13.high;
        }
      }
    }
    else {
      fVar14 = float32_to_floatx80_m68k(0x42800000,status);
      fVar17._10_6_ = 0;
      fVar17.low = (long)Var4;
      fVar17.high = (short)(Var4 >> 0x40);
      b_00._10_6_ = 0;
      b_00.low = (long)fVar14._0_10_;
      b_00.high = (short)(fVar14._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(fVar17,b_00,status);
      a_02._10_6_ = 0;
      a_02.low = (long)fVar14._0_10_;
      a_02.high = (short)(fVar14._0_10_ >> 0x40);
      uVar9 = floatx80_to_int32_m68k(a_02,status);
      fVar14 = int32_to_floatx80_m68k(uVar9,status);
      uVar10 = uVar9 & 0x3f;
      m1 = (int)uVar9 / 0x40;
      if (((int)uVar9 < 0) && (uVar10 != 0)) {
        m1 = m1 + -1;
      }
      local_58 = m1 / 2;
      if ((m1 < 0) && ((m1 & 1U) != 0)) {
        local_58 = local_58 + -1;
      }
      fVar15 = packFloatx80('\0',(m1 - local_58) + 0x3fff,0x8000000000000000);
      uVar11 = exp2_tbl[(int)uVar10].low;
      fact1.low._0_2_ = (short)*(undefined8 *)&exp2_tbl[(int)uVar10].high;
      sVar7 = (short)fact1.low + (short)local_58;
      uVar3 = exp2_tbl2[(int)uVar10];
      uVar9 = exp2_tbl2[(int)uVar10];
      fVar16 = float32_to_floatx80_m68k(0x3c800000,status);
      a_03._10_6_ = 0;
      a_03.low = (long)fVar14._0_10_;
      a_03.high = (short)(fVar14._0_10_ >> 0x40);
      b_01._10_6_ = 0;
      b_01.low = (long)fVar16._0_10_;
      b_01.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_03,b_01,status);
      a_04._10_6_ = 0;
      a_04.low = (long)Var4;
      a_04.high = (short)(Var4 >> 0x40);
      b_02._10_6_ = 0;
      b_02.low = (long)fVar14._0_10_;
      b_02.high = (short)(fVar14._0_10_ >> 0x40);
      fVar14 = floatx80_sub_m68k(a_04,b_02,status);
      fVar16 = packFloatx80('\0',0x3ffe,0xb17217f7d1cf79ac);
      a_05._10_6_ = 0;
      a_05.low = (long)fVar14._0_10_;
      a_05.high = (short)(fVar14._0_10_ >> 0x40);
      b_03._10_6_ = 0;
      b_03.low = (long)fVar16._0_10_;
      b_03.high = (short)(fVar16._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_05,b_03,status);
      Var5 = fVar14._0_10_;
      a_06._10_6_ = 0;
      a_06.low = (long)Var5;
      a_06.high = (short)(Var5 >> 0x40);
      b_04._10_6_ = 0;
      b_04.low = (long)Var5;
      b_04.high = (short)(Var5 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_06,b_04,status);
      fVar16 = float64_to_floatx80_m68k(0x3f56c16d6f7bd0b2,status);
      fVar17 = float64_to_floatx80_m68k(0x3f811112302c712c,status);
      Var4 = fVar14._0_10_;
      a_07._10_6_ = 0;
      a_07.low = (long)fVar16._0_10_;
      a_07.high = (short)(fVar16._0_10_ >> 0x40);
      b_05._10_6_ = 0;
      b_05.low = (long)Var4;
      b_05.high = (short)(Var4 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_07,b_05,status);
      a_08._10_6_ = 0;
      a_08.low = (long)fVar17._0_10_;
      a_08.high = (short)(fVar17._0_10_ >> 0x40);
      b_06._10_6_ = 0;
      b_06.low = (long)Var4;
      b_06.high = (short)(Var4 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_08,b_06,status);
      fVar17 = float64_to_floatx80_m68k(0x3fa5555555554cc1,status);
      a_09._10_6_ = 0;
      a_09.low = (long)fVar14._0_10_;
      a_09.high = (short)(fVar14._0_10_ >> 0x40);
      b_07._10_6_ = 0;
      b_07.low = (long)fVar17._0_10_;
      b_07.high = (short)(fVar17._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_09,b_07,status);
      fVar17 = float64_to_floatx80_m68k(0x3fc5555555554a54,status);
      a_10._10_6_ = 0;
      a_10.low = (long)fVar16._0_10_;
      a_10.high = (short)(fVar16._0_10_ >> 0x40);
      b_08._10_6_ = 0;
      b_08.low = (long)fVar17._0_10_;
      b_08.high = (short)(fVar17._0_10_ >> 0x40);
      fVar16 = floatx80_add_m68k(a_10,b_08,status);
      a_11._10_6_ = 0;
      a_11.low = (long)fVar14._0_10_;
      a_11.high = (short)(fVar14._0_10_ >> 0x40);
      b_09._10_6_ = 0;
      b_09.low = (long)Var4;
      b_09.high = (short)(Var4 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_11,b_09,status);
      a_12._10_6_ = 0;
      a_12.low = (long)fVar16._0_10_;
      a_12.high = (short)(fVar16._0_10_ >> 0x40);
      b_10._10_6_ = 0;
      b_10.low = (long)Var4;
      b_10.high = (short)(Var4 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_12,b_10,status);
      fVar17 = float64_to_floatx80_m68k(0x3fe0000000000000,status);
      a_13._10_6_ = 0;
      a_13.low = (long)fVar14._0_10_;
      a_13.high = (short)(fVar14._0_10_ >> 0x40);
      b_11._10_6_ = 0;
      b_11.low = (long)fVar17._0_10_;
      b_11.high = (short)(fVar17._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_13,b_11,status);
      a_14._10_6_ = 0;
      a_14.low = (long)fVar16._0_10_;
      a_14.high = (short)(fVar16._0_10_ >> 0x40);
      b_12._10_6_ = 0;
      b_12.low = (long)Var5;
      b_12.high = (short)(Var5 >> 0x40);
      fVar16 = floatx80_mul_m68k(a_14,b_12,status);
      a_15._10_6_ = 0;
      a_15.low = (long)fVar14._0_10_;
      a_15.high = (short)(fVar14._0_10_ >> 0x40);
      b_13._10_6_ = 0;
      b_13.low = (long)Var4;
      b_13.high = (short)(Var4 >> 0x40);
      fVar14 = floatx80_mul_m68k(a_15,b_13,status);
      a_16._10_6_ = 0;
      a_16.low = (long)Var5;
      a_16.high = (short)(Var5 >> 0x40);
      b_14._10_6_ = 0;
      b_14.low = (long)fVar16._0_10_;
      b_14.high = (short)(fVar16._0_10_ >> 0x40);
      fVar16 = floatx80_add_m68k(a_16,b_14,status);
      a_17._10_6_ = 0;
      a_17.low = (long)fVar16._0_10_;
      a_17.high = (short)(fVar16._0_10_ >> 0x40);
      b_15._10_6_ = 0;
      b_15.low = (long)fVar14._0_10_;
      b_15.high = (short)(fVar14._0_10_ >> 0x40);
      fVar14 = floatx80_add_m68k(a_17,b_15,status);
      b_16.high = sVar7;
      b_16.low = uVar11;
      a_18._10_6_ = 0;
      a_18.low = (long)fVar14._0_10_;
      a_18.high = (short)(fVar14._0_10_ >> 0x40);
      b_16._10_6_ = 0;
      fVar14 = floatx80_mul_m68k(a_18,b_16,status);
      b_17.high = (short)(uVar3 >> 0x10) + (short)local_58;
      b_17.low = (ulong)(uVar9 & 0xffff) << 0x30;
      a_19._10_6_ = 0;
      a_19.low = (long)fVar14._0_10_;
      a_19.high = (short)(fVar14._0_10_ >> 0x40);
      b_17._10_6_ = 0;
      fVar14 = floatx80_add_m68k(a_19,b_17,status);
      b_18.high = sVar7;
      b_18.low = uVar11;
      a_20._10_6_ = 0;
      a_20.low = (long)fVar14._0_10_;
      a_20.high = (short)(fVar14._0_10_ >> 0x40);
      b_18._10_6_ = 0;
      fVar14 = floatx80_add_m68k(a_20,b_18,status);
      status->float_rounding_mode = cVar1;
      status->floatx80_rounding_precision = cVar2;
      a_21._10_6_ = 0;
      a_21.low = (long)fVar14._0_10_;
      a_21.high = (short)(fVar14._0_10_ >> 0x40);
      b_19._10_6_ = 0;
      b_19.low = (long)fVar15._0_10_;
      b_19.high = (short)(fVar15._0_10_ >> 0x40);
      fVar14 = floatx80_mul_m68k(a_21,b_19,status);
      uVar12 = fVar14.high;
      float_raise_m68k(' ',status);
      fVar13._8_8_ = extraout_RDX_00;
      fVar13.low = fVar14.low;
    }
  }
  a_local._8_8_ = fVar13.low;
  fVar18._10_6_ = fVar13._10_6_;
  fVar18.high = uVar12;
  fVar18.low = a_local._8_8_;
  return fVar18;
}

Assistant:

floatx80 floatx80_twotox(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    int8_t user_rnd_mode, user_rnd_prec;

    int32_t compact, n, j, l, m, m1;
    floatx80 fp0, fp1, fp2, fp3, adjfact, fact1, fact2;

    aSig = extractFloatx80Frac(a);
    aExp = extractFloatx80Exp(a);
    aSign = extractFloatx80Sign(a);

    if (aExp == 0x7FFF) {
        if ((uint64_t) (aSig << 1)) {
            return propagateFloatx80NaNOneArg(a, status);
        }
        if (aSign) {
            return packFloatx80(0, 0, 0);
        }
        return packFloatx80(0, floatx80_infinity.high,
                            floatx80_infinity.low);
    }

    if (aExp == 0 && aSig == 0) {
        return packFloatx80(0, one_exp, one_sig);
    }

    user_rnd_mode = status->float_rounding_mode;
    user_rnd_prec = status->floatx80_rounding_precision;
    status->float_rounding_mode = float_round_nearest_even;
    status->floatx80_rounding_precision = 80;

    fp0 = a;

    compact = floatx80_make_compact(aExp, aSig);

    if (compact < 0x3FB98000 || compact > 0x400D80C0) {
        /* |X| > 16480 or |X| < 2^(-70) */
        if (compact > 0x3FFF8000) { /* |X| > 16480 */
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            if (aSign) {
                return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                            0, -0x1000, aSig, 0, status);
            } else {
                return roundAndPackFloatx80(status->floatx80_rounding_precision,
                                            0, 0x8000, aSig, 0, status);
            }
        } else { /* |X| < 2^(-70) */
            status->float_rounding_mode = user_rnd_mode;
            status->floatx80_rounding_precision = user_rnd_prec;

            a = floatx80_add(fp0, float32_to_floatx80(
                             make_float32(0x3F800000), status),
                             status); /* 1 + X */

            float_raise(float_flag_inexact, status);

            return a;
        }
    } else { /* 2^(-70) <= |X| <= 16480 */
        fp1 = fp0; /* X */
        fp1 = floatx80_mul(fp1, float32_to_floatx80(
                           make_float32(0x42800000), status),
                           status); /* X * 64 */
        n = floatx80_to_int32(fp1, status);
        fp1 = int32_to_floatx80(n, status);
        j = n & 0x3F;
        l = n / 64; /* NOTE: this is really arithmetic right shift by 6 */
        if (n < 0 && j) {
            /*
             * arithmetic right shift is division and
             * round towards minus infinity
             */
            l--;
        }
        m = l / 2; /* NOTE: this is really arithmetic right shift by 1 */
        if (l < 0 && (l & 1)) {
            /*
             * arithmetic right shift is division and
             * round towards minus infinity
             */
            m--;
        }
        m1 = l - m;
        m1 += 0x3FFF; /* ADJFACT IS 2^(M') */

        adjfact = packFloatx80(0, m1, one_sig);
        fact1 = exp2_tbl[j];
        fact1.high += m;
        fact2.high = exp2_tbl2[j] >> 16;
        fact2.high += m;
        fact2.low = (uint64_t)(exp2_tbl2[j] & 0xFFFF);
        fact2.low <<= 48;

        fp1 = floatx80_mul(fp1, float32_to_floatx80(
                           make_float32(0x3C800000), status),
                           status); /* (1/64)*N */
        fp0 = floatx80_sub(fp0, fp1, status); /* X - (1/64)*INT(64 X) */
        fp2 = packFloatx80(0, 0x3FFE, UINT64_C(0xB17217F7D1CF79AC)); /* LOG2 */
        fp0 = floatx80_mul(fp0, fp2, status); /* R */

        /* EXPR */
        fp1 = floatx80_mul(fp0, fp0, status); /* S = R*R */
        fp2 = float64_to_floatx80(make_float64(0x3F56C16D6F7BD0B2),
                                  status); /* A5 */
        fp3 = float64_to_floatx80(make_float64(0x3F811112302C712C),
                                  status); /* A4 */
        fp2 = floatx80_mul(fp2, fp1, status); /* S*A5 */
        fp3 = floatx80_mul(fp3, fp1, status); /* S*A4 */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x3FA5555555554CC1), status),
                           status); /* A3+S*A5 */
        fp3 = floatx80_add(fp3, float64_to_floatx80(
                           make_float64(0x3FC5555555554A54), status),
                           status); /* A2+S*A4 */
        fp2 = floatx80_mul(fp2, fp1, status); /* S*(A3+S*A5) */
        fp3 = floatx80_mul(fp3, fp1, status); /* S*(A2+S*A4) */
        fp2 = floatx80_add(fp2, float64_to_floatx80(
                           make_float64(0x3FE0000000000000), status),
                           status); /* A1+S*(A3+S*A5) */
        fp3 = floatx80_mul(fp3, fp0, status); /* R*S*(A2+S*A4) */

        fp2 = floatx80_mul(fp2, fp1, status); /* S*(A1+S*(A3+S*A5)) */
        fp0 = floatx80_add(fp0, fp3, status); /* R+R*S*(A2+S*A4) */
        fp0 = floatx80_add(fp0, fp2, status); /* EXP(R) - 1 */

        fp0 = floatx80_mul(fp0, fact1, status);
        fp0 = floatx80_add(fp0, fact2, status);
        fp0 = floatx80_add(fp0, fact1, status);

        status->float_rounding_mode = user_rnd_mode;
        status->floatx80_rounding_precision = user_rnd_prec;

        a = floatx80_mul(fp0, adjfact, status);

        float_raise(float_flag_inexact, status);

        return a;
    }
}